

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepidexample.cpp
# Opt level: O2

void drawBlob(vector<std::vector<Rgbaz,_std::allocator<Rgbaz>_>,_std::allocator<std::vector<Rgbaz,_std::allocator<Rgbaz>_>_>_>
              *image,int width,int height,float x,float y,float z,int size,int color,uint32_t *ids)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  value_type local_50;
  
  fVar5 = (float)(int)(size * 0x28 | 5);
  Imath_3_2::half::operator=(&local_50.z,z);
  local_50.id0 = ids[0];
  local_50.id1 = ids[1];
  local_50.id2 = ids[2];
  local_50.id3 = ids[3];
  local_50.id4 = ids[4];
  if (width < 1) {
    width = 0;
  }
  if (height < 1) {
    height = 0;
  }
  lVar2 = 0;
  for (iVar1 = 0; iVar1 != height; iVar1 = iVar1 + 1) {
    lVar4 = (long)(int)lVar2 * 0x18;
    for (lVar3 = 0; width != (int)lVar3; lVar3 = lVar3 + 1) {
      fVar6 = x - (float)(int)lVar3;
      fVar7 = fVar6 * fVar6 + ((float)iVar1 - y) * ((float)iVar1 - y);
      fVar6 = expf(-fVar7 / fVar5);
      fVar6 = (1.0 - SQRT(fVar7) / fVar5) * fVar6;
      if (0.001 < fVar6) {
        Imath_3_2::half::operator=
                  (&local_50.r,
                   *(float *)(_imath_half_to_float_table + (ulong)colors[color].r._h * 4) * fVar6);
        Imath_3_2::half::operator=
                  (&local_50.g,
                   *(float *)(_imath_half_to_float_table + (ulong)colors[color].g._h * 4) * fVar6);
        Imath_3_2::half::operator=
                  (&local_50.b,
                   *(float *)(_imath_half_to_float_table + (ulong)colors[color].b._h * 4) * fVar6);
        Imath_3_2::half::operator=(&local_50.a,fVar6);
        std::vector<Rgbaz,_std::allocator<Rgbaz>_>::push_back
                  ((vector<Rgbaz,_std::allocator<Rgbaz>_> *)
                   ((long)&(((image->
                             super__Vector_base<std::vector<Rgbaz,_std::allocator<Rgbaz>_>,_std::allocator<std::vector<Rgbaz,_std::allocator<Rgbaz>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<Rgbaz,_std::allocator<Rgbaz>_>)._M_impl.
                           super__Vector_impl_data + lVar4),&local_50);
      }
      lVar4 = lVar4 + 0x18;
    }
    lVar2 = (int)lVar2 + lVar3;
  }
  return;
}

Assistant:

void
drawBlob (
    std::vector<std::vector<Rgbaz>>& image,
    int                              width,
    int                              height,
    float                            x,
    float                            y,
    float                            z,
    int                              size,
    int                              color,
    const uint32_t*                  ids)
{
    //
    // draw windowed gaussian centered at (x,y)
    //

    float sigma = 5 + 40 * size;

    int ptr = 0;

    Rgbaz point;
    point.z   = z;
    point.id0 = ids[0];
    point.id1 = ids[1];
    point.id2 = ids[2];
    point.id3 = ids[3];
    point.id4 = ids[4];

    for (int j = 0; j < height; ++j)
    {
        for (int i = 0; i < width; ++i)
        {
            float dist_sq = (x - i) * (x - i) + (j - y) * (j - y);
            float scale =
                exp (-dist_sq / sigma) * (1.f - sqrt (dist_sq) / sigma);

            if (scale > 0.001)
            {
                point.r = colors[color].r * scale;
                point.g = colors[color].g * scale;
                point.b = colors[color].b * scale;
                point.a = scale;

                image[ptr].push_back (point);
            }

            ptr++;
        }
    }
}